

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O2

void __thiscall
NodeParser::parseTankReact
          (NodeParser *this,Node *node,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  InputError *this_00;
  string *s;
  string local_40;
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    iVar3 = (*(node->super_Element)._vptr_Element[2])(node);
    if (iVar3 == 1) {
      s = pbVar1 + 2;
      bVar2 = Utilities::parseNumber<double>(s,(double *)&node[1].super_Element.index);
      if (!bVar2) {
        this_00 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&local_40,(string *)s);
        InputError::InputError(this_00,6,&local_40);
        __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
      }
    }
  }
  return;
}

Assistant:

void NodeParser::parseTankReact(Node* node, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - TANK keyword
    // 1 - tank ID
    // 2 - reaction coeff. (1/days)

    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];

    // ... cast Node to Tank

    if ( node->type() != Node::TANK ) return;
    Tank* tank = static_cast<Tank*>(node);

    // ... read reaction coefficient in 1/days

    if ( !Utilities::parseNumber(tokens[2], tank->bulkCoeff) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }
}